

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest::~InterpTest(InterpTest *this)

{
  InterpTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__InterpTest_003fbe20;
  wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr(&this->inst_);
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr(&this->mod_);
  wabt::interp::ModuleDesc::~ModuleDesc(&this->module_desc_);
  wabt::interp::Store::~Store(&this->store_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void ReadModule(const std::vector<u8>& data) {
    Errors errors;
    ReadBinaryOptions options;
    Result result = ReadBinaryInterp("<internal>", data.data(), data.size(),
                                     options, &errors, &module_desc_);
    ASSERT_EQ(Result::Ok, result)
        << FormatErrorsToString(errors, Location::Type::Binary);
  }